

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

uint64_t __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::ext_tag
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  json_storage_kind jVar1;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  jVar1 = storage_kind(in_RDI);
  if (jVar1 == json_const_reference) {
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::json_const_reference_storage>
              (in_RDI);
    json_const_reference_storage::value((json_const_reference_storage *)0x2191c3);
    local_8 = ext_tag((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                      CONCAT17(jVar1,in_stack_ffffffffffffffe8));
  }
  else if (jVar1 == json_reference) {
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
              (in_RDI);
    json_reference_storage::value((json_reference_storage *)0x2191e4);
    local_8 = ext_tag((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                      CONCAT17(jVar1,in_stack_ffffffffffffffe8));
  }
  else if (jVar1 == byte_str) {
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage>
              (in_RDI);
    local_8 = byte_string_storage::ext_tag((byte_string_storage *)0x2191aa);
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

uint64_t ext_tag() const
        {
            switch (storage_kind())
            {
                case json_storage_kind::byte_str:
                {
                    return cast<byte_string_storage>().ext_tag();
                }
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().ext_tag();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().ext_tag();
                default:
                    return 0;
            }
        }